

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::
ExtensionDeclarationsTest_MismatchDotPrefixTypeExpectingMessage_Test::TestBody
          (ExtensionDeclarationsTest_MismatchDotPrefixTypeExpectingMessage_Test *this)

{
  char *in_RCX;
  ExtensionDeclarationsTestParams *in_R8;
  char *pcVar1;
  string_view file_text;
  MockErrorCollector error_collector;
  DescriptorPool pool;
  StatusOr<google::protobuf::FileDescriptorProto> file_proto;
  AssertHelper local_1e8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1e0;
  AssertHelper local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d0;
  MockErrorCollector local_1c8;
  undefined1 local_180 [8];
  _Head_base<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_false>
  local_178;
  ExtDeclEnforcementLevel local_13c;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FileDescriptorProto>_1 local_108;
  FileDescriptorProto local_100;
  
  testing::
  WithParamInterface<google::protobuf::descriptor_unittest::ExtensionDeclarationsTestParams>::
  GetParam();
  file_text._M_str = in_RCX;
  file_text._M_len =
       (size_t)
       "\n        name: \"foo.proto\"\n        package: \"ext.test\"\n        message_type {\n          name: \"Foo\"\n          extension_range {\n            start: 4\n            end: 99999\n            options: {\n              declaration: {\n                number: 10\n                full_name: \".ext.test.bar\"\n                type: \".int32\"\n              }\n            }\n          }\n        }\n        extension { name: \"bar\" number: 10 type: TYPE_INT32 extendee: \"Foo\" }\n      "
  ;
  ParameterizeFileProto
            ((StatusOr<google::protobuf::FileDescriptorProto> *)&local_108.status_,
             (descriptor_unittest *)0x1cd,file_text,in_R8);
  local_1c8.super_ErrorCollector._vptr_ErrorCollector =
       (_func_int **)((ulong)local_1c8.super_ErrorCollector._vptr_ErrorCollector._4_4_ << 0x20);
  testing::internal::
  PredicateFormatterFromMatcher<StatusIsMatcherP2<absl::lts_20250127::StatusCode,testing::internal::AnythingMatcher>>
  ::operator()(local_180,(char *)&local_1c8,
               (StatusOr<google::protobuf::FileDescriptorProto> *)0x128bcb3);
  if (local_180[0] == '\0') {
    testing::Message::Message((Message *)&local_1c8);
    if (local_178._M_head_impl ==
        (flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
         *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = *(char **)local_178._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x32db,pcVar1);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    if (local_1c8.super_ErrorCollector._vptr_ErrorCollector != (_func_int **)0x0) {
      (**(code **)(*local_1c8.super_ErrorCollector._vptr_ErrorCollector + 8))();
    }
    if ((_Tuple_impl<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
         )local_178._M_head_impl !=
        (flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
         *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_178,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_178._M_head_impl);
    }
  }
  else {
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178._M_head_impl
        != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_178,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_178._M_head_impl);
    }
    DescriptorPool::DescriptorPool((DescriptorPool *)local_180);
    local_13c = kAllExtensions;
    local_1c8.text_._M_dataplus._M_p = (pointer)&local_1c8.text_.field_2;
    local_1c8.super_ErrorCollector._vptr_ErrorCollector =
         (_func_int **)&PTR__MockErrorCollector_01883858;
    local_1c8.text_._M_string_length = 0;
    local_1c8.text_.field_2._M_local_buf[0] = '\0';
    local_1c8.warning_text_._M_dataplus._M_p = (pointer)&local_1c8.warning_text_.field_2;
    local_1c8.warning_text_._M_string_length = 0;
    local_1c8.warning_text_.field_2._M_local_buf[0] = '\0';
    if (local_108 !=
        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FileDescriptorProto>_1)0x1) {
      absl::lts_20250127::internal_statusor::Helper::Crash(&local_108.status_);
    }
    local_1e0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         DescriptorPool::BuildFileCollectingErrors
                   ((DescriptorPool *)local_180,&local_100,&local_1c8.super_ErrorCollector);
    local_1e8.data_ = (AssertHelperData *)0x0;
    testing::internal::CmpHelperEQ<google::protobuf::FileDescriptor_const*,decltype(nullptr)>
              ((internal *)&local_1d8,
               "pool.BuildFileCollectingErrors(*file_proto, &error_collector)","nullptr",
               (FileDescriptor **)&local_1e0,&local_1e8.data_);
    if (local_1d8.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_1e0);
      if (local_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar1 = (local_1d0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x32e1,pcVar1);
      testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1e0);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      if ((FileDescriptor *)local_1e0._M_head_impl != (FileDescriptor *)0x0) {
        (**(code **)(*(long *)local_1e0._M_head_impl + 8))();
      }
    }
    if (local_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1d0,local_1d0);
    }
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[116]>
              ((internal *)&local_1d8,"error_collector.text_",
               "\"foo.proto: ext.test.bar: EXTENDEE: \\\"ext.test.Foo\\\" extension \" \"field 10 is expected to be type \\\".int32\\\", not \\\"int32\\\".\\n\""
               ,&local_1c8.text_,
               (char (*) [116])
               "foo.proto: ext.test.bar: EXTENDEE: \"ext.test.Foo\" extension field 10 is expected to be type \".int32\", not \"int32\".\n"
              );
    if (local_1d8.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_1e0);
      if (local_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar1 = (local_1d0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x32e4,pcVar1);
      testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1e0);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      if ((FileDescriptor *)local_1e0._M_head_impl != (FileDescriptor *)0x0) {
        (**(code **)(*(long *)local_1e0._M_head_impl + 8))();
      }
    }
    if (local_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1d0,local_1d0);
    }
    MockErrorCollector::~MockErrorCollector(&local_1c8);
    DescriptorPool::~DescriptorPool((DescriptorPool *)local_180);
  }
  absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FileDescriptorProto>::
  ~StatusOrData((StatusOrData<google::protobuf::FileDescriptorProto> *)&local_108.status_);
  return;
}

Assistant:

TEST_P(ExtensionDeclarationsTest, MismatchDotPrefixTypeExpectingMessage) {
  absl::StatusOr<FileDescriptorProto> file_proto = ParameterizeFileProto(
      R"pb(
        name: "foo.proto"
        package: "ext.test"
        message_type {
          name: "Foo"
          extension_range {
            start: 4
            end: 99999
            options: {
              declaration: {
                number: 10
                full_name: ".ext.test.bar"
                type: ".int32"
              }
            }
          }
        }
        extension { name: "bar" number: 10 type: TYPE_INT32 extendee: "Foo" }
      )pb",
      GetParam());
  ASSERT_OK(file_proto);

  DescriptorPool pool;
  pool.EnforceExtensionDeclarations(ExtDeclEnforcementLevel::kAllExtensions);
  MockErrorCollector error_collector;
  EXPECT_EQ(pool.BuildFileCollectingErrors(*file_proto, &error_collector),
            nullptr);
  EXPECT_EQ(error_collector.text_,
            "foo.proto: ext.test.bar: EXTENDEE: \"ext.test.Foo\" extension "
            "field 10 is expected to be type \".int32\", not \"int32\".\n");
}